

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_sse2.c
# Opt level: O2

uint32_t Predictor11_SSE2(uint32_t *left,uint32_t *top)

{
  undefined1 auVar1 [15];
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  unkuint9 Var15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [13];
  undefined1 auVar18 [15];
  unkuint9 Var19;
  undefined1 auVar20 [11];
  undefined1 auVar21 [12];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined8 uVar26;
  ushort uVar27;
  undefined1 auVar28 [15];
  short sVar30;
  undefined1 auVar29 [16];
  undefined1 auVar31 [15];
  int16_t out [8];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  auVar32 = ZEXT416(top[-1]);
  auVar33 = psubusb(auVar32,ZEXT416(*top));
  auVar29 = psubusb(ZEXT416(*top),auVar32);
  auVar28 = auVar29._0_15_ | auVar33._0_15_;
  auVar33 = psubusb(ZEXT416(*left),auVar32);
  auVar29 = psubusb(auVar32,ZEXT416(*left));
  auVar31 = auVar29._0_15_ | auVar33._0_15_;
  auVar1[0xd] = 0;
  auVar1._0_13_ = auVar28._0_13_;
  auVar1[0xe] = auVar28[7];
  auVar3[0xc] = auVar28[6];
  auVar3._0_12_ = auVar28._0_12_;
  auVar3._13_2_ = auVar1._13_2_;
  auVar5[0xb] = 0;
  auVar5._0_11_ = auVar28._0_11_;
  auVar5._12_3_ = auVar3._12_3_;
  auVar7[10] = auVar28[5];
  auVar7._0_10_ = auVar28._0_10_;
  auVar7._11_4_ = auVar5._11_4_;
  auVar9[9] = 0;
  auVar9._0_9_ = auVar28._0_9_;
  auVar9._10_5_ = auVar7._10_5_;
  auVar11[8] = auVar28[4];
  auVar11._0_8_ = auVar28._0_8_;
  auVar11._9_6_ = auVar9._9_6_;
  auVar14._7_8_ = 0;
  auVar14._0_7_ = auVar11._8_7_;
  Var15 = CONCAT81(SUB158(auVar14 << 0x40,7),auVar28[3]);
  auVar22._9_6_ = 0;
  auVar22._0_9_ = Var15;
  auVar16._1_10_ = SUB1510(auVar22 << 0x30,5);
  auVar16[0] = auVar28[2];
  auVar23._11_4_ = 0;
  auVar23._0_11_ = auVar16;
  auVar17._1_12_ = SUB1512(auVar23 << 0x20,3);
  auVar17[0] = auVar28[1];
  uVar27 = CONCAT11(0,auVar28[0]);
  auVar13._2_13_ = auVar17;
  auVar13._0_2_ = uVar27;
  auVar28[0xd] = 0;
  auVar28._0_13_ = auVar31._0_13_;
  auVar28[0xe] = auVar31[7];
  auVar2[0xc] = auVar31[6];
  auVar2._0_12_ = auVar31._0_12_;
  auVar2._13_2_ = auVar28._13_2_;
  auVar4[0xb] = 0;
  auVar4._0_11_ = auVar31._0_11_;
  auVar4._12_3_ = auVar2._12_3_;
  auVar6[10] = auVar31[5];
  auVar6._0_10_ = auVar31._0_10_;
  auVar6._11_4_ = auVar4._11_4_;
  auVar8[9] = 0;
  auVar8._0_9_ = auVar31._0_9_;
  auVar8._10_5_ = auVar6._10_5_;
  auVar10[8] = auVar31[4];
  auVar10._0_8_ = auVar31._0_8_;
  auVar10._9_6_ = auVar8._9_6_;
  auVar18._7_8_ = 0;
  auVar18._0_7_ = auVar10._8_7_;
  Var19 = CONCAT81(SUB158(auVar18 << 0x40,7),auVar31[3]);
  auVar24._9_6_ = 0;
  auVar24._0_9_ = Var19;
  auVar20._1_10_ = SUB1510(auVar24 << 0x30,5);
  auVar20[0] = auVar31[2];
  auVar25._11_4_ = 0;
  auVar25._0_11_ = auVar20;
  auVar12[2] = auVar31[1];
  auVar12._0_2_ = auVar31._0_2_;
  auVar12._3_12_ = SUB1512(auVar25 << 0x20,3);
  sVar30 = (short)Var15;
  auVar32._0_12_ = auVar13._0_12_;
  auVar32._12_2_ = sVar30;
  auVar32._14_2_ = (short)Var19 - sVar30;
  auVar29._12_4_ = auVar32._12_4_;
  auVar29._0_10_ = auVar13._0_10_;
  auVar29._10_2_ = auVar20._0_2_ - auVar16._0_2_;
  uVar26 = CONCAT62(auVar29._10_6_,auVar16._0_2_);
  auVar21._4_8_ = uVar26;
  auVar21._2_2_ = auVar12._2_2_ - auVar17._0_2_;
  auVar21._0_2_ = auVar17._0_2_;
  if ((auVar29._12_4_ >> 0x10) + (auVar21._0_4_ >> 0x10) +
      ((int)uVar26 >> 0x10) + (int)(short)((auVar31._0_2_ & 0xff) - uVar27) < 1) {
    return *top;
  }
  return *left;
}

Assistant:

static WEBP_INLINE uint32_t Select_SSE2(uint32_t a, uint32_t b, uint32_t c) {
  int pa_minus_pb;
  const __m128i zero = _mm_setzero_si128();
  const __m128i A0 = _mm_cvtsi32_si128((int)a);
  const __m128i B0 = _mm_cvtsi32_si128((int)b);
  const __m128i C0 = _mm_cvtsi32_si128((int)c);
  const __m128i AC0 = _mm_subs_epu8(A0, C0);
  const __m128i CA0 = _mm_subs_epu8(C0, A0);
  const __m128i BC0 = _mm_subs_epu8(B0, C0);
  const __m128i CB0 = _mm_subs_epu8(C0, B0);
  const __m128i AC = _mm_or_si128(AC0, CA0);
  const __m128i BC = _mm_or_si128(BC0, CB0);
  const __m128i pa = _mm_unpacklo_epi8(AC, zero);  // |a - c|
  const __m128i pb = _mm_unpacklo_epi8(BC, zero);  // |b - c|
  const __m128i diff = _mm_sub_epi16(pb, pa);
  {
    int16_t out[8];
    _mm_storeu_si128((__m128i*)out, diff);
    pa_minus_pb = out[0] + out[1] + out[2] + out[3];
  }
  return (pa_minus_pb <= 0) ? a : b;
}